

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_equalobj(lua_State *L,TValue *t1,TValue *t2)

{
  byte bVar1;
  int iVar2;
  TValue *f;
  lua_CFunction p_Var3;
  Table *pTVar4;
  uint uVar5;
  bool bVar6;
  lua_Integer i2;
  lua_Integer i1;
  
  bVar1 = t1->tt_ & 0x3f;
  if (bVar1 != (t2->tt_ & 0x3f)) {
    if ((t2->tt_ & 0xf) != 3 || (t1->tt_ & 0xf) != 3) {
      return 0;
    }
    iVar2 = luaV_tointegerns(t1,&i1,F2Ieq);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = luaV_tointegerns(t2,&i2,F2Ieq);
    if (iVar2 == 0) {
      return 0;
    }
    bVar6 = i1 == i2;
LAB_0011bf03:
    return (uint)bVar6;
  }
  uVar5 = 1;
  switch(bVar1) {
  case 0:
  case 1:
  case 0x11:
    goto switchD_0011bea1_caseD_0;
  default:
    bVar6 = (t1->value_).gc == (t2->value_).gc;
    goto LAB_0011bf03;
  case 5:
    p_Var3 = (t2->value_).f;
    if ((t1->value_).f == p_Var3) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar4 = *(Table **)((t1->value_).f + 0x20);
    if ((pTVar4 == (Table *)0x0) || ((pTVar4->flags & 0x20) != 0)) {
LAB_0011bfb4:
      pTVar4 = *(Table **)(p_Var3 + 0x20);
      goto LAB_0011bfb8;
    }
    f = luaT_gettm(pTVar4,TM_EQ,L->l_G->tmname[5]);
    if (f == (TValue *)0x0) {
      p_Var3 = (t2->value_).f;
      goto LAB_0011bfb4;
    }
    break;
  case 7:
    p_Var3 = (t2->value_).f;
    if ((t1->value_).f == p_Var3) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar4 = *(Table **)((t1->value_).f + 0x18);
    if ((pTVar4 != (Table *)0x0) && ((pTVar4->flags & 0x20) == 0)) {
      f = luaT_gettm(pTVar4,TM_EQ,L->l_G->tmname[5]);
      if (f != (TValue *)0x0) break;
      p_Var3 = (t2->value_).f;
    }
    pTVar4 = *(Table **)(p_Var3 + 0x18);
LAB_0011bfb8:
    if (pTVar4 == (Table *)0x0) {
      return 0;
    }
    if ((pTVar4->flags & 0x20) != 0) {
      return 0;
    }
    f = luaT_gettm(pTVar4,TM_EQ,L->l_G->tmname[5]);
    if (f == (TValue *)0x0) {
      return 0;
    }
    break;
  case 0x13:
    return -(uint)((t2->value_).n == (t1->value_).n) & 1;
  case 0x14:
    iVar2 = luaS_eqlngstr((TString *)(t1->value_).gc,(TString *)(t2->value_).gc);
    return iVar2;
  }
  bVar1 = luaT_callTMres(L,f,t1,t2,(L->top).p);
  uVar5 = (uint)((bVar1 & 0xf) != 0 && bVar1 != 1);
switchD_0011bea1_caseD_0:
  return uVar5;
}

Assistant:

int luaV_equalobj (lua_State *L, const TValue *t1, const TValue *t2) {
  const TValue *tm;
  if (ttypetag(t1) != ttypetag(t2)) {  /* not the same variant? */
    if (ttype(t1) != ttype(t2) || ttype(t1) != LUA_TNUMBER)
      return 0;  /* only numbers can be equal with different variants */
    else {  /* two numbers with different variants */
      /* One of them is an integer. If the other does not have an
         integer value, they cannot be equal; otherwise, compare their
         integer values. */
      lua_Integer i1, i2;
      return (luaV_tointegerns(t1, &i1, F2Ieq) &&
              luaV_tointegerns(t2, &i2, F2Ieq) &&
              i1 == i2);
    }
  }
  /* values have same type and same variant */
  switch (ttypetag(t1)) {
    case LUA_VNIL: case LUA_VFALSE: case LUA_VTRUE: return 1;
    case LUA_VNUMINT: return (ivalue(t1) == ivalue(t2));
    case LUA_VNUMFLT: return luai_numeq(fltvalue(t1), fltvalue(t2));
    case LUA_VLIGHTUSERDATA: return pvalue(t1) == pvalue(t2);
    case LUA_VLCF: return fvalue(t1) == fvalue(t2);
    case LUA_VSHRSTR: return eqshrstr(tsvalue(t1), tsvalue(t2));
    case LUA_VLNGSTR: return luaS_eqlngstr(tsvalue(t1), tsvalue(t2));
    case LUA_VUSERDATA: {
      if (uvalue(t1) == uvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, uvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, uvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    case LUA_VTABLE: {
      if (hvalue(t1) == hvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, hvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, hvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    default:
      return gcvalue(t1) == gcvalue(t2);
  }
  if (tm == NULL)  /* no TM? */
    return 0;  /* objects are different */
  else {
    int tag = luaT_callTMres(L, tm, t1, t2, L->top.p);  /* call TM */
    return !tagisfalse(tag);
  }
}